

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint
          (btGeneric6DofSpring2Constraint *this,btRigidBody *rbA,btRigidBody *rbB,
          btTransform *frameInA,btTransform *frameInB,RotateOrder rotOrder)

{
  btVector3 *this_00;
  btTranslationalLimitMotor2 *in_RCX;
  btGeneric6DofSpring2Constraint *this_01;
  undefined8 *in_RDI;
  undefined4 in_R9D;
  btRigidBody *in_stack_ffffffffffffff58;
  btRigidBody *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  btTypedConstraint *in_stack_ffffffffffffff70;
  btRotationalLimitMotor2 *local_80;
  undefined8 *local_68;
  undefined8 *local_50;
  
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffff70,
             (btTypedConstraintType)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *in_RDI = &PTR__btGeneric6DofSpring2Constraint_002e71c0;
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff60,(btTransform *)in_stack_ffffffffffffff58);
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff60,(btTransform *)in_stack_ffffffffffffff58);
  local_50 = in_RDI + 0x19;
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff60);
    local_50 = (undefined8 *)((long)local_50 + 0x54);
  } while (local_50 != (undefined8 *)((long)in_RDI + 0x1c4));
  local_68 = (undefined8 *)((long)in_RDI + 0x1c4);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff60);
    local_68 = (undefined8 *)((long)local_68 + 0x54);
  } while (local_68 != in_RDI + 0x58);
  btTranslationalLimitMotor2::btTranslationalLimitMotor2(in_RCX);
  local_80 = (btRotationalLimitMotor2 *)(in_RDI + 0x7c);
  do {
    btRotationalLimitMotor2::btRotationalLimitMotor2(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != (btRotationalLimitMotor2 *)(in_RDI + 0x9d));
  *(undefined4 *)(in_RDI + 0x9d) = in_R9D;
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff60);
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff60);
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x56c));
  this_00 = (btVector3 *)((long)in_RDI + 0x57c);
  this_01 = (btGeneric6DofSpring2Constraint *)((long)in_RDI + 0x5ac);
  do {
    btVector3::btVector3(this_00);
    this_00 = (btVector3 *)(this_00->m_floats + 4);
  } while ((btGeneric6DofSpring2Constraint *)this_00 != this_01);
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x5ac));
  *(undefined4 *)(in_RDI + 0xb9) = 0;
  calculateTransforms(this_01);
  return;
}

Assistant:

btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB, RotateOrder rotOrder)
	: btTypedConstraint(D6_SPRING_2_CONSTRAINT_TYPE, rbA, rbB)
	, m_frameInA(frameInA)
	, m_frameInB(frameInB)
	, m_rotateOrder(rotOrder)	
	, m_flags(0)
{
	calculateTransforms();
}